

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_math.hpp
# Opt level: O0

void __thiscall
trng::int_math::power<2147461007,_889744251>::power(power<2147461007,_889744251> *this)

{
  uint32_t extraout_EAX;
  uint32_t extraout_EAX_00;
  power<2147461007,_889744251> *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  int32_t i_1;
  int32_t i;
  int local_10;
  int local_c;
  
  for (local_c = 0; local_c < 0x10000; local_c = local_c + 1) {
    in_XMM0_Qa = pow(in_RDI,in_XMM0_Qa,in_XMM1_Qa);
    in_RDI->b_power0[local_c] = extraout_EAX;
  }
  for (local_10 = 0; local_10 < 0x8000; local_10 = local_10 + 1) {
    in_XMM0_Qa = pow(in_RDI,in_XMM0_Qa,in_XMM1_Qa);
    in_RDI->b_power1[local_10] = extraout_EAX_00;
  }
  return;
}

Assistant:

power() {
        for (int32_t i{0}; i < 0x10000; ++i)
          b_power0[i] = pow(i);
        for (int32_t i{0}; i < 0x08000; ++i)
          b_power1[i] = pow(i * 0x10000);
      }